

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnintf.c
# Opt level: O3

UINT8 device_ym2203_link_ssg(void *param,UINT8 devID,DEV_INFO *defInfSSG)

{
  UINT8 UVar1;
  undefined7 in_register_00000031;
  ssg_callbacks ssgfunc;
  ssg_callbacks sStack_38;
  
  UVar1 = 0xf0;
  if ((int)CONCAT71(in_register_00000031,devID) == 0) {
    if (defInfSSG == (DEV_INFO *)0x0) {
      UVar1 = '\0';
      ym2203_link_ssg(param,(ssg_callbacks *)0x0,(void *)0x0);
    }
    else {
      UVar1 = get_ssg_funcs(defInfSSG->devDef,&sStack_38);
      if (UVar1 == '\0') {
        ym2203_link_ssg(param,&sStack_38,defInfSSG->dataPtr);
        UVar1 = '\0';
      }
    }
  }
  return UVar1;
}

Assistant:

static UINT8 device_ym2203_link_ssg(void* param, UINT8 devID, const DEV_INFO* defInfSSG)
{
	ssg_callbacks ssgfunc;
	UINT8 retVal;
	
	if (devID != LINKDEV_SSG)
		return EERR_UNK_DEVICE;
	
	if (defInfSSG == NULL)
	{
		ym2203_link_ssg(param, NULL, NULL);
		retVal = 0x00;
	}
	else
	{
		retVal = get_ssg_funcs(defInfSSG->devDef, &ssgfunc);
		if (! retVal)
			ym2203_link_ssg(param, &ssgfunc, defInfSSG->dataPtr);
	}
	return retVal;
}